

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_manager::tracker_manager
          (tracker_manager *this,send_fun_t *send_fun,send_fun_hostname_t *send_fun_hostname,
          counters *stats_counters,resolver_interface *resolver,session_settings *sett,
          session_logger *ses)

{
  session_settings *sett_local;
  resolver_interface *resolver_local;
  counters *stats_counters_local;
  send_fun_hostname_t *send_fun_hostname_local;
  send_fun_t *send_fun_local;
  tracker_manager *this_local;
  
  ::std::
  unordered_map<unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>_>
  ::unordered_map(&this->m_udp_conns);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ::vector(&this->m_http_conns);
  ::std::
  deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ::deque(&this->m_queued);
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun,send_fun);
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun_hostname,send_fun_hostname);
  this->m_host_resolver = resolver;
  this->m_settings = sett;
  this->m_stats_counters = stats_counters;
  this->m_abort = false;
  this->m_ses = ses;
  return;
}

Assistant:

tracker_manager::tracker_manager(send_fun_t send_fun
		, send_fun_hostname_t send_fun_hostname
		, counters& stats_counters
		, aux::resolver_interface& resolver
		, aux::session_settings const& sett
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, aux::session_logger& ses
#endif
		)
		: m_send_fun(std::move(send_fun))
		, m_send_fun_hostname(std::move(send_fun_hostname))
		, m_host_resolver(resolver)
		, m_settings(sett)
		, m_stats_counters(stats_counters)
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, m_ses(ses)
#endif
	{}